

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O1

RandomDataProviderProvider * getRandomDataProviderProvider(void)

{
  undefined8 in_RAX;
  RandomDataProviderProvider *pRVar1;
  
  pRVar1 = (RandomDataProviderProvider *)
           CONCAT71((int7)((ulong)in_RAX >> 8),getRandomDataProviderProvider()::rdpp);
  if (getRandomDataProviderProvider()::rdpp == '\0') {
    pRVar1 = (RandomDataProviderProvider *)
             __cxa_guard_acquire(&getRandomDataProviderProvider()::rdpp);
    if ((int)pRVar1 != 0) {
      _ZZL29getRandomDataProviderProvidervE4rdpp_0 = CryptoRandomDataProvider::getInstance();
      _ZZL29getRandomDataProviderProvidervE4rdpp_1 = _ZZL29getRandomDataProviderProvidervE4rdpp_0;
      pRVar1 = (RandomDataProviderProvider *)
               __cxa_guard_release(&getRandomDataProviderProvider()::rdpp);
      return pRVar1;
    }
  }
  return pRVar1;
}

Assistant:

static RandomDataProviderProvider*
getRandomDataProviderProvider()
{
    // Thread-safe static initializer
    static RandomDataProviderProvider rdpp;
    return &rdpp;
}